

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

int SUNHashMap_GetValue(SUNHashMap map,char *key,void **value)

{
  int iVar1;
  uint64_t uVar2;
  undefined8 *in_RDX;
  _func_int_int_SUNHashMapKeyValue_void_ptr *in_RSI;
  long in_RDI;
  int retval;
  int idx;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if (((in_RDI == 0) || (in_RSI == (_func_int_int_SUNHashMapKeyValue_void_ptr *)0x0)) ||
     (in_RDX == (undefined8 *)0x0)) {
    iVar3 = -1;
  }
  else {
    uVar2 = fnv1a_hash((char *)in_RSI);
    iVar3 = (int)(uVar2 % (ulong)(long)*(int *)(in_RDI + 4));
    if (*(long *)(*(long *)(in_RDI + 8) + (long)iVar3 * 8) == 0) {
      iVar3 = -2;
    }
    else {
      iVar1 = strcmp((char *)**(undefined8 **)(*(long *)(in_RDI + 8) + (long)iVar3 * 8),
                     (char *)in_RSI);
      if (iVar1 != 0) {
        iVar1 = SUNHashMap_Iterate((SUNHashMap)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                   (int)((ulong)in_RDI >> 0x20),in_RSI,in_RDX);
        if (iVar1 < 0) {
          return -1;
        }
        if (iVar1 == *(int *)(in_RDI + 4)) {
          return -2;
        }
      }
      *in_RDX = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + (long)iVar3 * 8) + 8);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int SUNHashMap_GetValue(SUNHashMap map, const char* key, void** value)
{
  int idx;
  int retval;

  if (map == NULL || key == NULL || value == NULL) { return (-1); }

  /* We want the index to be in (0, map->max_size) */
  idx = (int)(fnv1a_hash(key) % map->max_size);

  /* Check if the key exists */
  if (map->buckets[idx] == NULL) { return (-2); }

  /* Check to see if this is a collision */
  if (strcmp(map->buckets[idx]->key, key))
  {
    /* Keys did not match, so we have a collision and need to probe */
    retval = SUNHashMap_Iterate(map, idx + 1, sunHashMapLinearProbeGet, key);
    if (retval < 0) { return (-1); /* error occurred */ }
    if (retval == map->max_size) { return (-2); /* not found */ }
  }

  /* Return a reference to the value only */
  *value = map->buckets[idx]->value;

  return (0);
}